

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH64_hash_t XXH3_64bits_withSeed(void *data,size_t len,XXH64_hash_t seed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  U32 UVar4;
  uint uVar5;
  U64 UVar6;
  U64 UVar7;
  U64 UVar8;
  XXH64_hash_t XVar9;
  XXH64_hash_t in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  U64 acc_2;
  char *key;
  BYTE *p;
  U64 ll2_8;
  U64 ll1_8;
  U64 *key64_8;
  U64 ll2_7;
  U64 ll1_7;
  U64 *key64_7;
  U64 ll2_6;
  U64 ll1_6;
  U64 *key64_6;
  U64 ll2_5;
  U64 ll1_5;
  U64 *key64_5;
  U64 ll2_4;
  U64 ll1_4;
  U64 *key64_4;
  U64 ll2_3;
  U64 ll1_3;
  U64 *key64_3;
  U64 ll2_2;
  U64 ll1_2;
  U64 *key64_2;
  U64 ll2_1;
  U64 ll1_1;
  U64 *key64_1;
  U64 acc;
  U64 ll2;
  U64 ll1;
  U64 *key64;
  U64 acc_1;
  U32 l2;
  U32 l1;
  U32 *key32;
  U64 ll11;
  U32 l2_1;
  U32 l1_1;
  BYTE c3;
  BYTE c2;
  BYTE c1;
  U32 *key32_1;
  U32 *ptr32_1;
  U32 *ptr32;
  U32 *ptr32_3;
  U32 *ptr32_2;
  U32 *ptr32_5;
  U32 *ptr32_4;
  U32 *ptr32_7;
  U32 *ptr32_6;
  U32 *ptr32_9;
  U32 *ptr32_8;
  U32 *ptr32_11;
  U32 *ptr32_10;
  U32 *ptr32_13;
  U32 *ptr32_12;
  U32 *ptr32_15;
  U32 *ptr32_14;
  U32 *ptr32_17;
  U32 *ptr32_16;
  ulong local_638;
  ulong local_630;
  ulong local_610;
  ulong local_608;
  ulong local_5e8;
  ulong local_5e0;
  ulong local_5c0;
  ulong local_5b8;
  ulong local_598;
  ulong local_590;
  ulong local_570;
  ulong local_568;
  ulong local_548;
  ulong local_540;
  XXH64_hash_t in_stack_fffffffffffffad8;
  size_t in_stack_fffffffffffffae0;
  void *in_stack_fffffffffffffae8;
  U32 local_510;
  U32 local_50c;
  U64 local_4f8;
  U64 local_4e8;
  long local_4e0;
  XXH64_hash_t local_4b0;
  XXH64_hash_t local_490;
  
  if (in_RSI < 0x11) {
    if (in_RSI < 9) {
      iVar1 = (int)(in_RDX >> 0x20);
      if (in_RSI < 4) {
        local_490 = in_RDX;
        if (in_RSI != 0) {
          local_490 = XXH3_avalanche((ulong)((uint)*in_RDI + (uint)in_RDI[in_RSI >> 1] * 0x100 +
                                             (int)in_RDX + 0xb8fe6c39) *
                                     (ulong)((int)in_RSI + (uint)in_RDI[in_RSI - 1] * 4 + iVar1 +
                                            0x23a44bbe));
        }
      }
      else {
        iVar2 = XXH_isLittleEndian();
        if (iVar2 == 0) {
          UVar4 = XXH_read32(in_RDI);
          local_50c = XXH_swap32(UVar4);
        }
        else {
          local_50c = XXH_read32(in_RDI);
        }
        uVar3 = local_50c + (int)in_RDX + 0xb8fe6c39;
        iVar2 = XXH_isLittleEndian();
        if (iVar2 == 0) {
          UVar4 = XXH_read32(in_RDI + (in_RSI - 4));
          local_510 = XXH_swap32(UVar4);
        }
        else {
          local_510 = XXH_read32(in_RDI + (in_RSI - 4));
        }
        uVar5 = local_510 + iVar1 + 0x23a44bbe;
        local_490 = XXH3_avalanche(in_RSI + uVar3 + ((ulong)uVar5 << 0x20) +
                                   (ulong)uVar3 * (ulong)uVar5);
      }
    }
    else {
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar6 = XXH_read64(in_RDI);
        local_4e8 = XXH_swap64(UVar6);
      }
      else {
        local_4e8 = XXH_read64(in_RDI);
      }
      XXH_isLittleEndian();
      UVar6 = local_4e8 + 0x23a44bbeb8fe6c39 + in_RDX;
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar7 = XXH_read64(in_RDI + (in_RSI - 8));
        local_4f8 = XXH_swap64(UVar7);
      }
      else {
        local_4f8 = XXH_read64(in_RDI + (in_RSI - 8));
      }
      XXH_isLittleEndian();
      UVar7 = (local_4f8 + 0xf721ad1c7c01812c) - in_RDX;
      UVar8 = XXH3_mul128_fold64(UVar6,UVar7);
      local_490 = XXH3_avalanche(in_RSI + UVar6 + UVar7 + UVar8);
    }
    local_4b0 = local_490;
  }
  else {
    local_4e0 = in_RSI * -0x61c8864e7a143579;
    if (0x20 < in_RSI) {
      if (0x40 < in_RSI) {
        if (0x60 < in_RSI) {
          if (0x80 < in_RSI) {
            XVar9 = XXH3_hashLong_64b(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                                      in_stack_fffffffffffffad8);
            return XVar9;
          }
          iVar1 = XXH_isLittleEndian();
          if (iVar1 == 0) {
            UVar6 = XXH_read64(in_RDI + 0x30);
            UVar6 = XXH_swap64(UVar6);
          }
          else {
            UVar6 = XXH_read64(in_RDI + 0x30);
          }
          iVar1 = XXH_isLittleEndian();
          if (iVar1 == 0) {
            UVar7 = XXH_read64(in_RDI + 0x38);
            UVar7 = XXH_swap64(UVar7);
          }
          else {
            UVar7 = XXH_read64(in_RDI + 0x38);
          }
          XXH_isLittleEndian();
          XXH_isLittleEndian();
          UVar6 = XXH3_mul128_fold64(UVar6 ^ in_RDX + 0xe39c343fa8fa763f,
                                     UVar7 ^ 0xc70b4f1df9dcbbc7 - in_RDX);
          iVar1 = XXH_isLittleEndian();
          if (iVar1 == 0) {
            UVar7 = XXH_read64(in_RDI + (in_RSI - 0x40));
            local_540 = XXH_swap64(UVar7);
          }
          else {
            local_540 = XXH_read64(in_RDI + (in_RSI - 0x40));
          }
          iVar1 = XXH_isLittleEndian();
          if (iVar1 == 0) {
            UVar7 = XXH_read64(in_RDI + (in_RSI - 0x38));
            local_548 = XXH_swap64(UVar7);
          }
          else {
            local_548 = XXH_read64(in_RDI + (in_RSI - 0x38));
          }
          XXH_isLittleEndian();
          XXH_isLittleEndian();
          UVar7 = XXH3_mul128_fold64(local_540 ^ in_RDX + 0xcdb459318a51e04b,
                                     local_548 ^ 0xd9787364c89f7ec9 - in_RDX);
          local_4e0 = UVar7 + UVar6 + local_4e0;
        }
        iVar1 = XXH_isLittleEndian();
        if (iVar1 == 0) {
          UVar6 = XXH_read64(in_RDI + 0x20);
          local_568 = XXH_swap64(UVar6);
        }
        else {
          local_568 = XXH_read64(in_RDI + 0x20);
        }
        iVar1 = XXH_isLittleEndian();
        if (iVar1 == 0) {
          UVar6 = XXH_read64(in_RDI + 0x28);
          local_570 = XXH_swap64(UVar6);
        }
        else {
          local_570 = XXH_read64(in_RDI + 0x28);
        }
        XXH_isLittleEndian();
        XXH_isLittleEndian();
        UVar6 = XXH3_mul128_fold64(local_568 ^ in_RDX + 0x91c300cb3c2852bb,
                                   local_570 ^ 0x1b532ea388d0658b - in_RDX);
        iVar1 = XXH_isLittleEndian();
        if (iVar1 == 0) {
          UVar7 = XXH_read64(in_RDI + (in_RSI - 0x30));
          local_590 = XXH_swap64(UVar7);
        }
        else {
          local_590 = XXH_read64(in_RDI + (in_RSI - 0x30));
        }
        iVar1 = XXH_isLittleEndian();
        if (iVar1 == 0) {
          UVar7 = XXH_read64(in_RDI + (in_RSI - 0x28));
          local_598 = XXH_swap64(UVar7);
        }
        else {
          local_598 = XXH_read64(in_RDI + (in_RSI - 0x28));
        }
        XXH_isLittleEndian();
        XXH_isLittleEndian();
        UVar7 = XXH3_mul128_fold64(local_590 ^ in_RDX + 0xa20df94e71644897,
                                   local_598 ^ 0xa9deacd83819ef46 - in_RDX);
        local_4e0 = UVar7 + UVar6 + local_4e0;
      }
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar6 = XXH_read64(in_RDI + 0x10);
        local_5b8 = XXH_swap64(UVar6);
      }
      else {
        local_5b8 = XXH_read64(in_RDI + 0x10);
      }
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar6 = XXH_read64(in_RDI + 0x18);
        local_5c0 = XXH_swap64(UVar6);
      }
      else {
        local_5c0 = XXH_read64(in_RDI + 0x18);
      }
      XXH_isLittleEndian();
      XXH_isLittleEndian();
      UVar6 = XXH3_mul128_fold64(local_5b8 ^ in_RDX + 0xccc0e578cb79e64e,
                                 local_5c0 ^ 0xccff7221825ad07d - in_RDX);
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar7 = XXH_read64(in_RDI + (in_RSI - 0x20));
        local_5e0 = XXH_swap64(UVar7);
      }
      else {
        local_5e0 = XXH_read64(in_RDI + (in_RSI - 0x20));
      }
      iVar1 = XXH_isLittleEndian();
      if (iVar1 == 0) {
        UVar7 = XXH_read64(in_RDI + (in_RSI - 0x18));
        local_5e8 = XXH_swap64(UVar7);
      }
      else {
        local_5e8 = XXH_read64(in_RDI + (in_RSI - 0x18));
      }
      XXH_isLittleEndian();
      XXH_isLittleEndian();
      UVar7 = XXH3_mul128_fold64(local_5e0 ^ in_RDX + 0xf743248eb8084674,
                                 local_5e8 ^ 0x813a264ce03590e6 - in_RDX);
      local_4e0 = UVar7 + UVar6 + local_4e0;
    }
    iVar1 = XXH_isLittleEndian();
    if (iVar1 == 0) {
      UVar6 = XXH_read64(in_RDI);
      local_608 = XXH_swap64(UVar6);
    }
    else {
      local_608 = XXH_read64(in_RDI);
    }
    iVar1 = XXH_isLittleEndian();
    if (iVar1 == 0) {
      UVar6 = XXH_read64(in_RDI + 8);
      local_610 = XXH_swap64(UVar6);
    }
    else {
      local_610 = XXH_read64(in_RDI + 8);
    }
    XXH_isLittleEndian();
    XXH_isLittleEndian();
    UVar6 = XXH3_mul128_fold64(local_608 ^ in_RDX + 0x23a44bbeb8fe6c39,
                               local_610 ^ 0xf721ad1c7c01812c - in_RDX);
    iVar1 = XXH_isLittleEndian();
    if (iVar1 == 0) {
      UVar7 = XXH_read64(in_RDI + (in_RSI - 0x10));
      local_630 = XXH_swap64(UVar7);
    }
    else {
      local_630 = XXH_read64(in_RDI + (in_RSI - 0x10));
    }
    iVar1 = XXH_isLittleEndian();
    if (iVar1 == 0) {
      UVar7 = XXH_read64(in_RDI + (in_RSI - 8));
      local_638 = XXH_swap64(UVar7);
    }
    else {
      local_638 = XXH_read64(in_RDI + (in_RSI - 8));
    }
    XXH_isLittleEndian();
    XXH_isLittleEndian();
    UVar7 = XXH3_mul128_fold64(local_630 ^ in_RDX + 0x839097dbded46de9,
                               local_638 ^ 0xb7b3671f7240a4a4 - in_RDX);
    local_4b0 = XXH3_avalanche(UVar7 + UVar6 + local_4e0);
  }
  return local_4b0;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* data, size_t len, XXH64_hash_t seed)
{
    const BYTE* const p = (const BYTE*)data;
    const char* const key = (const char*)kKey;

    if (len <= 16) return XXH3_len_0to16_64b(data, len, seed);

    {   U64 acc = PRIME64_1 * len;
        if (len > 32) {
            if (len > 64) {
                if (len > 96) {
                    if (len > 128) return XXH3_hashLong_64b(data, len, seed);

                    acc += XXH3_mix16B(p+48, key+96, seed);
                    acc += XXH3_mix16B(p+len-64, key+112, seed);
                }

                acc += XXH3_mix16B(p+32, key+64, seed);
                acc += XXH3_mix16B(p+len-48, key+80, seed);
            }

            acc += XXH3_mix16B(p+16, key+32, seed);
            acc += XXH3_mix16B(p+len-32, key+48, seed);
        }

        acc += XXH3_mix16B(p+0, key+0, seed);
        acc += XXH3_mix16B(p+len-16, key+16, seed);

        return XXH3_avalanche(acc);
    }
}